

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O0

int_t dLUMemInit(fact_t fact,void *work,int_t lwork,int m,int n,int_t annz,int panel_size,
                double fill_ratio,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,int **iwork,
                double **dwork)

{
  int iVar1;
  int_t iVar2;
  ExpHeader *pEVar3;
  bool bVar4;
  char local_1a8 [8];
  char msg [256];
  int local_a0;
  int_t nzlumax;
  int_t nzumax;
  int_t nzlmax;
  int_t *xusub;
  int_t *usub;
  double *ucol;
  int_t *xlusup;
  double *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  NCformat *Ustore;
  SCformat *Lstore;
  int local_38;
  int dword;
  int iword;
  int info;
  double fill_ratio_local;
  int_t annz_local;
  int n_local;
  int m_local;
  int_t lwork_local;
  void *work_local;
  fact_t fact_local;
  
  local_38 = 4;
  Lstore._4_4_ = 8;
  Glu->n = n;
  Glu->num_expansions = 0;
  _iword = fill_ratio;
  fill_ratio_local._0_4_ = annz;
  fill_ratio_local._4_4_ = n;
  annz_local = m;
  n_local = lwork;
  _m_local = work;
  work_local._0_4_ = fact;
  pEVar3 = (ExpHeader *)superlu_malloc(0x60);
  Glu->expanders = pEVar3;
  if (Glu->expanders == (ExpHeader *)0x0) {
    sprintf(local_1a8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for expanders",0xd4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dmemory.c");
    superlu_abort_and_exit(local_1a8);
  }
  if ((fact_t)work_local == SamePattern_SameRowPerm) {
    Ustore = (NCformat *)L->Store;
    xsup = (int *)U->Store;
    supno = Ustore[1].rowind;
    lsub = (int_t *)Ustore[1].nzval;
    lusup = *(double **)(Ustore + 1);
    ucol = (double *)Ustore->rowind;
    _nzumax = *(int_t **)(xsup + 6);
    nzlumax = Glu->nzlmax;
    local_a0 = Glu->nzumax;
    msg._252_4_ = Glu->nzlumax;
    if (n_local == -1) {
      work_local._4_4_ =
           (fill_ratio_local._4_4_ * 5 + 5) * local_38 +
           (panel_size * 2 + 7) * annz_local * 4 + (panel_size + 1) * annz_local * 8 +
           (nzlumax + local_a0) * local_38 + (msg._252_4_ + local_a0) * Lstore._4_4_ +
           fill_ratio_local._4_4_;
    }
    else {
      if (n_local == 0) {
        Glu->MemModel = SYSTEM;
      }
      else {
        Glu->MemModel = USER;
        (Glu->stack).top2 = n_local / 4 << 2;
        (Glu->stack).size = (Glu->stack).top2;
      }
      xlsub = Ustore->colptr;
      Glu->expanders[2].mem = xlsub;
      xlusup = (int_t *)Ustore->nzval;
      Glu->expanders->mem = xlusup;
      xusub = *(int_t **)(xsup + 4);
      Glu->expanders[3].mem = xusub;
      usub = *(int_t **)(xsup + 2);
      Glu->expanders[1].mem = usub;
      Glu->expanders[2].size = nzlumax;
      Glu->expanders->size = msg._252_4_;
      Glu->expanders[3].size = local_a0;
      Glu->expanders[1].size = local_a0;
LAB_0010a50e:
      Glu->xsup = supno;
      Glu->supno = lsub;
      Glu->lsub = xlsub;
      Glu->xlsub = (int_t *)lusup;
      Glu->lusup = xlusup;
      Glu->xlusup = (int_t *)ucol;
      Glu->ucol = usub;
      Glu->usub = xusub;
      Glu->xusub = _nzumax;
      Glu->nzlmax = nzlumax;
      Glu->nzumax = local_a0;
      Glu->nzlumax = msg._252_4_;
      iVar1 = dLUWorkInit(annz_local,fill_ratio_local._4_4_,panel_size,iwork,dwork,Glu);
      if (iVar1 == 0) {
        Glu->num_expansions = Glu->num_expansions + 1;
        work_local._4_4_ = 0;
      }
      else {
        dword = iVar1;
        iVar2 = dmemory_usage(nzlumax,local_a0,msg._252_4_,fill_ratio_local._4_4_);
        work_local._4_4_ = iVar1 + iVar2 + fill_ratio_local._4_4_;
      }
    }
  }
  else {
    msg._252_4_ = (undefined4)(_iword * (double)fill_ratio_local._0_4_);
    if (n_local == -1) {
      work_local._4_4_ =
           (fill_ratio_local._4_4_ * 5 + 5) * local_38 +
           (panel_size * 2 + 7) * annz_local * 4 + (panel_size + 1) * annz_local * 8 +
           msg._252_4_ * 2 * local_38 + msg._252_4_ * 2 * Lstore._4_4_ + fill_ratio_local._4_4_;
    }
    else {
      local_a0 = msg._252_4_;
      nzlumax = msg._252_4_;
      dSetupSpace(_m_local,n_local,Glu);
      if (Glu->MemModel == SYSTEM) {
        supno = int32Malloc(fill_ratio_local._4_4_ + 1);
        lsub = int32Malloc(fill_ratio_local._4_4_ + 1);
        lusup = (double *)intMalloc(fill_ratio_local._4_4_ + 1);
        ucol = (double *)intMalloc(fill_ratio_local._4_4_ + 1);
        _nzumax = intMalloc(fill_ratio_local._4_4_ + 1);
      }
      else {
        supno = (int *)duser_malloc((fill_ratio_local._4_4_ + 1) * local_38,0,Glu);
        lsub = (int_t *)duser_malloc((fill_ratio_local._4_4_ + 1) * local_38,0,Glu);
        lusup = (double *)duser_malloc((fill_ratio_local._4_4_ + 1) * local_38,0,Glu);
        ucol = (double *)duser_malloc((fill_ratio_local._4_4_ + 1) * local_38,0,Glu);
        _nzumax = (int_t *)duser_malloc((fill_ratio_local._4_4_ + 1) * local_38,0,Glu);
      }
      xlusup = (int_t *)dexpand((int_t *)(msg + 0xfc),LUSUP,0,0,Glu);
      usub = (int_t *)dexpand(&local_a0,UCOL,0,0,Glu);
      xlsub = (int_t *)dexpand(&nzlumax,LSUB,0,0,Glu);
      xusub = (int_t *)dexpand(&local_a0,USUB,0,1,Glu);
      while( true ) {
        bVar4 = true;
        if (((xlusup != (int_t *)0x0) && (bVar4 = true, usub != (int_t *)0x0)) &&
           (bVar4 = true, xlsub != (int_t *)0x0)) {
          bVar4 = xusub == (int_t *)0x0;
        }
        if (!bVar4) goto LAB_0010a50e;
        if (Glu->MemModel == SYSTEM) {
          superlu_free(xlusup);
          superlu_free(usub);
          superlu_free(xlsub);
          superlu_free(xusub);
        }
        else {
          duser_free((msg._252_4_ + local_a0) * Lstore._4_4_ + (nzlumax + local_a0) * local_38,0,Glu
                    );
        }
        msg._252_4_ = (int)msg._252_4_ / 2;
        local_a0 = local_a0 / 2;
        nzlumax = nzlumax / 2;
        if ((int)msg._252_4_ < fill_ratio_local._0_4_) break;
        xlusup = (int_t *)dexpand((int_t *)(msg + 0xfc),LUSUP,0,0,Glu);
        usub = (int_t *)dexpand(&local_a0,UCOL,0,0,Glu);
        xlsub = (int_t *)dexpand(&nzlumax,LSUB,0,0,Glu);
        xusub = (int_t *)dexpand(&local_a0,USUB,0,1,Glu);
      }
      printf("Not enough memory to perform factorization.\n");
      iVar2 = dmemory_usage(nzlumax,local_a0,msg._252_4_,fill_ratio_local._4_4_);
      work_local._4_4_ = iVar2 + fill_ratio_local._4_4_;
    }
  }
  return work_local._4_4_;
}

Assistant:

int_t
dLUMemInit(fact_t fact, void *work, int_t lwork, int m, int n, int_t annz,
	  int panel_size, double fill_ratio, SuperMatrix *L, SuperMatrix *U,
          GlobalLU_t *Glu, int **iwork, double **dwork)
{
    int      info, iword, dword;
    SCformat *Lstore;
    NCformat *Ustore;
    int      *xsup, *supno;
    int_t    *lsub, *xlsub;
    double   *lusup;
    int_t    *xlusup;
    double   *ucol;
    int_t    *usub, *xusub;
    int_t    nzlmax, nzumax, nzlumax;
    
    iword     = sizeof(int);
    dword     = sizeof(double);
    Glu->n    = n;
    Glu->num_expansions = 0;

    Glu->expanders = (ExpHeader *) SUPERLU_MALLOC( NO_MEMTYPE *
                                                     sizeof(ExpHeader) );
    if ( !Glu->expanders ) ABORT("SUPERLU_MALLOC fails for expanders");
    
    if ( fact != SamePattern_SameRowPerm ) {
	/* Guess for L\U factors */
	nzumax = nzlumax = nzlmax = fill_ratio * annz;
	//nzlmax = SUPERLU_MAX(1, fill_ratio/4.) * annz;

	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else {
	    dSetupSpace(work, lwork, Glu);
	}
	
#if ( PRNTlevel >= 1 )
	printf("dLUMemInit() called: fill_ratio %.0f, nzlmax %lld, nzumax %lld\n", 
	       fill_ratio, (long long) nzlmax, (long long) nzumax);
	fflush(stdout);
#endif	
	
	/* Integer pointers for L\U factors */
	if ( Glu->MemModel == SYSTEM ) {
	    xsup   = int32Malloc(n+1);
	    supno  = int32Malloc(n+1);
	    xlsub  = intMalloc(n+1);
	    xlusup = intMalloc(n+1);
	    xusub  = intMalloc(n+1);
	} else {
	    xsup   = (int *)duser_malloc((n+1) * iword, HEAD, Glu);
	    supno  = (int *)duser_malloc((n+1) * iword, HEAD, Glu);
	    xlsub  = duser_malloc((n+1) * iword, HEAD, Glu);
	    xlusup = duser_malloc((n+1) * iword, HEAD, Glu);
	    xusub  = duser_malloc((n+1) * iword, HEAD, Glu);
	}

	lusup = (double *) dexpand( &nzlumax, LUSUP, 0, 0, Glu );
	ucol  = (double *) dexpand( &nzumax, UCOL, 0, 0, Glu );
	lsub  = (int_t *) dexpand( &nzlmax, LSUB, 0, 0, Glu );
	usub  = (int_t *) dexpand( &nzumax, USUB, 0, 1, Glu );

	while ( !lusup || !ucol || !lsub || !usub ) {
	    if ( Glu->MemModel == SYSTEM ) {
		SUPERLU_FREE(lusup); 
		SUPERLU_FREE(ucol); 
		SUPERLU_FREE(lsub); 
		SUPERLU_FREE(usub);
	    } else {
		duser_free((nzlumax+nzumax)*dword+(nzlmax+nzumax)*iword,
                            HEAD, Glu);
	    }
	    nzlumax /= 2;
	    nzumax /= 2;
	    nzlmax /= 2;
	    if ( nzlumax < annz ) {
		printf("Not enough memory to perform factorization.\n");
		return (dmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
	    }
#if ( PRNTlevel >= 1)
	    printf("dLUMemInit() reduce size: nzlmax %ld, nzumax %ld\n", 
		   (long) nzlmax, (long) nzumax);
	    fflush(stdout);
#endif
	    lusup = (double *) dexpand( &nzlumax, LUSUP, 0, 0, Glu );
	    ucol  = (double *) dexpand( &nzumax, UCOL, 0, 0, Glu );
	    lsub  = (int_t *) dexpand( &nzlmax, LSUB, 0, 0, Glu );
	    usub  = (int_t *) dexpand( &nzumax, USUB, 0, 1, Glu );
	}
	
    } else {
	/* fact == SamePattern_SameRowPerm */
	Lstore   = L->Store;
	Ustore   = U->Store;
	xsup     = Lstore->sup_to_col;
	supno    = Lstore->col_to_sup;
	xlsub    = Lstore->rowind_colptr;
	xlusup   = Lstore->nzval_colptr;
	xusub    = Ustore->colptr;
	nzlmax   = Glu->nzlmax;    /* max from previous factorization */
	nzumax   = Glu->nzumax;
	nzlumax  = Glu->nzlumax;
	
	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else if ( lwork == 0 ) {
	    Glu->MemModel = SYSTEM;
	} else {
	    Glu->MemModel = USER;
	    Glu->stack.top2 = (lwork/4)*4; /* must be word-addressable */
	    Glu->stack.size = Glu->stack.top2;
	}
	
	lsub  = Glu->expanders[LSUB].mem  = Lstore->rowind;
	lusup = Glu->expanders[LUSUP].mem = Lstore->nzval;
	usub  = Glu->expanders[USUB].mem  = Ustore->rowind;
	ucol  = Glu->expanders[UCOL].mem  = Ustore->nzval;;
	Glu->expanders[LSUB].size         = nzlmax;
	Glu->expanders[LUSUP].size        = nzlumax;
	Glu->expanders[USUB].size         = nzumax;
	Glu->expanders[UCOL].size         = nzumax;	
    }

    Glu->xsup    = xsup;
    Glu->supno   = supno;
    Glu->lsub    = lsub;
    Glu->xlsub   = xlsub;
    Glu->lusup   = (void *) lusup;
    Glu->xlusup  = xlusup;
    Glu->ucol    = (void *) ucol;
    Glu->usub    = usub;
    Glu->xusub   = xusub;
    Glu->nzlmax  = nzlmax;
    Glu->nzumax  = nzumax;
    Glu->nzlumax = nzlumax;
    
    info = dLUWorkInit(m, n, panel_size, iwork, dwork, Glu);
    if ( info )
	return ( info + dmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
    
    ++Glu->num_expansions;
    return 0;
    
}